

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::selectionSort<Minisat::Option*,Minisat::Option::OptionLt>(long array,uint size)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  OptionLt local_49;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (1 < (int)size) {
    local_48 = (ulong)(size - 1);
    uVar5 = 1;
    uVar4 = 0;
    do {
      local_40 = uVar4 + 1;
      uVar6 = uVar4 & 0xffffffff;
      local_38 = uVar5;
      do {
        bVar2 = Option::OptionLt::operator()
                          (&local_49,*(Option **)(array + uVar5 * 8),
                           *(Option **)(array + (long)(int)(uint)uVar6 * 8));
        uVar3 = (uint)uVar5;
        if (!bVar2) {
          uVar3 = (uint)uVar6;
        }
        uVar5 = uVar5 + 1;
        uVar6 = (ulong)uVar3;
      } while (size != uVar5);
      uVar1 = *(undefined8 *)(array + uVar4 * 8);
      *(undefined8 *)(array + uVar4 * 8) = *(undefined8 *)(array + (long)(int)uVar3 * 8);
      *(undefined8 *)(array + (long)(int)uVar3 * 8) = uVar1;
      uVar5 = local_38 + 1;
      uVar4 = local_40;
    } while (local_40 != local_48);
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}